

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall
QSideBarDelegate::initStyleOption
          (QSideBarDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  State *pSVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  uchar uVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  long in_FS_OFFSET;
  QMetaType local_58;
  QMetaType local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QStyledItemDelegate::initStyleOption((QStyledItemDelegate *)this,option,index);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (undefined1 *)0x0;
    local_48._16_8_ = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)0x2;
  }
  else {
    paVar6 = &local_48;
    (**(code **)(*(long *)pQVar2 + 0x90))(paVar6,pQVar2,index,0x102);
    if ((undefined1 *)0x3 < puStack_30) {
      local_50.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<bool>::metaType;
      local_58.d_ptr = (QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc);
      bVar3 = comparesEqual(&local_58,&local_50);
      if (bVar3) {
        if (((ulong)puStack_30 & 1) == 0) {
          paVar6 = &local_48;
        }
        else {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_48.shared + *(int *)(local_48.shared + 4));
        }
        uVar4 = paVar6->data[0];
      }
      else {
        local_58.d_ptr = local_58.d_ptr & 0xffffffffffffff00;
        QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_30 & 1) != 0) {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QMetaType::convert(QVar5,paVar6,local_50,&local_58);
        uVar4 = (uchar)local_58.d_ptr;
      }
      if (uVar4 == '\0') {
        pSVar1 = &(option->super_QStyleOption).state;
        *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                  super_QFlagsStorage<QStyle::StateFlag>.i =
             (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                   super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
      }
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSideBarDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    QStyledItemDelegate::initStyleOption(option,index);
    QVariant value = index.data(QUrlModel::EnabledRole);
    if (value.isValid()) {
        //If the bookmark/entry is not enabled then we paint it in gray
        if (!qvariant_cast<bool>(value))
            option->state &= ~QStyle::State_Enabled;
    }
}